

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_codecvt.cpp
# Opt level: O1

char * res(result r)

{
  if (r < 4) {
    return &DAT_001095a4 + *(int *)(&DAT_001095a4 + (ulong)r * 4);
  }
  return "error";
}

Assistant:

char const *res(std::codecvt_base::result r)
{
    switch(r){
    case std::codecvt_base::ok: return "ok";
    case std::codecvt_base::partial: return "partial";
    case std::codecvt_base::error: return "error";
    case std::codecvt_base::noconv: return "noconv";
    default:
        return "error";
    }
}